

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

void __thiscall Poll::compact(Poll *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  value_type local_34;
  value_type fd;
  int i;
  vector<pollfd,_std::allocator<pollfd>_> new_table;
  Poll *this_local;
  
  std::vector<pollfd,_std::allocator<pollfd>_>::vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)&fd.events);
  fd.fd = 0;
  while( true ) {
    uVar1 = (ulong)fd.fd;
    sVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::size(&this->fds);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->fds,(long)fd.fd);
    local_34 = *pvVar3;
    if (local_34.fd != -0x80000000) {
      std::vector<pollfd,_std::allocator<pollfd>_>::push_back
                ((vector<pollfd,_std::allocator<pollfd>_> *)&fd.events,&local_34);
    }
    fd.fd = fd.fd + 1;
  }
  std::vector<pollfd,_std::allocator<pollfd>_>::operator=
            (&this->fds,(vector<pollfd,_std::allocator<pollfd>_> *)&fd.events);
  std::vector<pollfd,_std::allocator<pollfd>_>::~vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)&fd.events);
  return;
}

Assistant:

void Poll::compact() {
  std::vector<pollfd> new_table;
  for (int i = 0; i < fds.size(); ++i) {
    auto fd = fds[i];
    if (fd.fd != DELETED) {
      new_table.push_back(fd);
    }
  }
  this->fds = new_table;
}